

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Vec_Str_t * Scl_LibertyReadGenlibStr(Scl_Tree_t *p,int fVerbose)

{
  int iVar1;
  Vec_Str_t *p_00;
  Scl_Item_t *pCell;
  char *pcVar2;
  Scl_Item_t *pPin;
  char *__format;
  int *piVar3;
  
  p_00 = Vec_StrAlloc(1000);
  Vec_StrPrintStr(p_00,"GATE          _const0_  0.000000  z=CONST0;\n");
  Vec_StrPrintStr(p_00,"GATE          _const1_  0.000000  z=CONST1;\n");
  pCell = Scl_LibertyItem(p,p->pItems->Child);
  do {
    if (pCell == (Scl_Item_t *)0x0) {
      Vec_StrPrintStr(p_00,"\n.end\n");
      Vec_StrPush(p_00,'\0');
      return p_00;
    }
    iVar1 = Scl_LibertyCompare(p,pCell->Key,"cell");
    if (iVar1 == 0) {
      iVar1 = Scl_LibertyReadCellIsFlop(p,pCell);
      if (iVar1 == 0) {
        iVar1 = Scl_LibertyReadCellIsThreeState(p,pCell);
        if (iVar1 == 0) {
          iVar1 = Scl_LibertyReadCellOutputNum(p,pCell);
          if (iVar1 != 0) {
            piVar3 = &pCell->Child;
            while( true ) {
              pPin = Scl_LibertyItem(p,*piVar3);
              if (pPin == (Scl_Item_t *)0x0) break;
              iVar1 = Scl_LibertyCompare(p,pPin->Key,"pin");
              if (iVar1 == 0) {
                Scl_LibertyReadPinFormula(p,pPin);
              }
              piVar3 = &pPin->Next;
            }
            goto LAB_0035224a;
          }
          __format = "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n";
        }
        else {
          __format = "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n";
        }
      }
      else {
        __format = "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n";
      }
      if (fVerbose != 0) {
        pcVar2 = Scl_LibertyReadString(p,pCell->Head);
        printf(__format,pcVar2);
      }
    }
LAB_0035224a:
    pCell = Scl_LibertyItem(p,pCell->Next);
  } while( true );
}

Assistant:

Vec_Str_t * Scl_LibertyReadGenlibStr( Scl_Tree_t * p, int fVerbose )
{
    Vec_Str_t * vStr;
    Scl_Item_t * pCell, * pOutput, * pInput;
    char * pFormula;
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE          _const0_  0.000000  z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE          _const1_  0.000000  z=CONST1;\n" );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pCell, "cell" )
    {
        if ( Scl_LibertyReadCellIsFlop(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped sequential cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellIsThreeState(p, pCell) )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped three-state cell \"%s\".\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        if ( Scl_LibertyReadCellOutputNum(p, pCell) == 0 )
        {
            if ( fVerbose )  printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" without logic function.\n", Scl_LibertyReadString(p, pCell->Head) );
            continue;
        }
        // iterate through output pins
        Scl_ItemForEachChildName( p, pCell, pOutput, "pin" )
        {
            if ( (pFormula = Scl_LibertyReadPinFormula(p, pOutput)) ) 
                continue;
            if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1") )
            {
                if ( fVerbose ) printf( "Scl_LibertyReadGenlib() skipped cell \"%s\" with constant formula \"%s\".\n", Scl_LibertyReadString(p, pCell->Head), pFormula );
                break;
            }
            Vec_StrPrintStr( vStr, "GATE " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pCell->Head) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadCellArea(p, pCell) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pOutput->Head) );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pFormula );
            Vec_StrPrintStr( vStr, ";\n" );
            // iterate through input pins
            Scl_ItemForEachChildName( p, pCell, pInput, "pin" )
            {
                if ( Scl_LibertyReadPinFormula(p, pInput) == NULL )
                    continue;
                Vec_StrPrintStr( vStr, "  PIN " );
                Vec_StrPrintStr( vStr, Scl_LibertyReadString(p, pInput->Head) );
                Vec_StrPrintStr( vStr, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
            }
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}